

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.c
# Opt level: O3

char * strip_function_from(char *token,char *function_name)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar2 = strlen(function_name);
  iVar1 = strncmp(function_name,token,sVar2);
  if (iVar1 == 0) {
    sVar3 = strlen(function_name);
    if (token[sVar3] == '(') {
      sVar4 = strlen(token);
      if (token[sVar4 - 1] == ')') {
        sVar4 = strlen(token);
        memmove(token,token + sVar2 + 1,(long)(((int)sVar4 - (int)sVar3) + -2) + 2);
        sVar2 = strlen(token);
        token[sVar2 - 1] = '\0';
      }
    }
  }
  return token;
}

Assistant:

static char *strip_function_from(char *token, const char *function_name) {
    if (begins_with(token, function_name) && token[strlen(function_name)] == '(' && last_char_of(token) == ')') {
        int parameter_length = strlen(token) - strlen(function_name) - strlen("()");
        move_parameter_to_beginning_of(token, function_name, parameter_length);
    }

    return token;
}